

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *pIVar3;
  ImGuiWindowSettings *pIVar4;
  
  pIVar2 = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
  pIVar3 = (ImGuiWindowSettings *)&pIVar2->Pos;
  pIVar4 = pIVar2;
  if (pIVar2 != (ImGuiWindowSettings *)0x0) {
    while (pIVar4 = pIVar3, pIVar3->ID != id) {
      iVar1._0_1_ = pIVar3[-1].Collapsed;
      iVar1._1_1_ = pIVar3[-1].WantApply;
      iVar1._2_2_ = *(undefined2 *)&pIVar3[-1].field_0xe;
      pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar1);
      if (pIVar3 == (ImGuiWindowSettings *)
                    ((long)&(pIVar2->Pos).x + (long)(GImGui->SettingsWindows).Buf.Size)) {
        return (ImGuiWindowSettings *)0x0;
      }
    }
  }
  return pIVar4;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}